

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qasn1element.cpp
# Opt level: O0

QByteArray * __thiscall QAsn1Element::toObjectName(QAsn1Element *this)

{
  QByteArray *in_RSI;
  QAsn1Element *in_RDI;
  long in_FS_OFFSET;
  QByteArray key;
  QByteArray *defaultValue;
  QAsn1Element *this_00;
  QByteArray local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d.size = -0x5555555555555556;
  local_28.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_28.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  defaultValue = &local_28;
  this_00 = in_RDI;
  toObjectId(in_RDI);
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>_>::operator->
            ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>_> *)
             0x11be88);
  QMap<QByteArray,_QByteArray>::value((QMap<QByteArray,_QByteArray> *)this_00,in_RSI,defaultValue);
  QByteArray::~QByteArray((QByteArray *)0x11bea7);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QByteArray *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QAsn1Element::toObjectName() const
{
    QByteArray key = toObjectId();
    return oidNameMap->value(key, key);
}